

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileExporter.cpp
# Opt level: O0

string * __thiscall
Assimp::XFileExporter::toXFileString_abi_cxx11_
          (string *__return_storage_ptr__,XFileExporter *this,aiString *name)

{
  int iVar1;
  char *pcVar2;
  undefined1 *puVar3;
  int local_80;
  allocator<char> local_79;
  int i;
  undefined1 local_55;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string pref;
  aiString *name_local;
  XFileExporter *this_local;
  string *str;
  
  pref.field_2._8_8_ = name;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,"",&local_41);
  std::allocator<char>::~allocator(&local_41);
  local_55 = 0;
  pcVar2 = aiString::C_Str((aiString *)pref.field_2._8_8_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&i,pcVar2,&local_79);
  std::operator+(__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i);
  std::__cxx11::string::~string((string *)&i);
  std::allocator<char>::~allocator(&local_79);
  for (local_80 = 0; iVar1 = std::__cxx11::string::length(), local_80 < iVar1;
      local_80 = local_80 + 1) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    if ((((*pcVar2 < '0') ||
         (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__),
         '9' < *pcVar2)) &&
        ((pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__),
         *pcVar2 < 'A' ||
         (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__),
         'Z' < *pcVar2)))) &&
       ((pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__),
        *pcVar2 < 'a' ||
        (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__),
        'z' < *pcVar2)))) {
      puVar3 = (undefined1 *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
      *puVar3 = 0x5f;
    }
  }
  local_55 = 1;
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string XFileExporter::toXFileString(aiString &name)
{
    std::string pref = ""; // node name prefix to prevent unexpected start of string
    std::string str = pref + std::string(name.C_Str());
    for (int i=0; i < (int) str.length(); ++i)
    {
        if ((str[i] >= '0' && str[i] <= '9') || // 0-9
            (str[i] >= 'A' && str[i] <= 'Z') || // A-Z
            (str[i] >= 'a' && str[i] <= 'z')) // a-z
            continue;
        str[i] = '_';
    }
    return str;
}